

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::GetLinkLibsCMP0065
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *linkLanguage,
          cmGeneratorTarget *tgt)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  TargetType TVar4;
  PolicyStatus PVar5;
  cmState *this_00;
  ostream *poVar6;
  string *psVar7;
  PolicyID id;
  PolicyID id_00;
  bool local_39b;
  bool local_382;
  bool local_35a;
  bool local_321;
  string local_300;
  byte local_2db;
  byte local_2da;
  allocator<char> local_2d9;
  string local_2d8;
  string local_2b8;
  byte local_293;
  byte local_292;
  allocator<char> local_291;
  string local_290;
  string local_270;
  string local_250;
  undefined1 local_230 [8];
  ostringstream w;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  bool local_64;
  byte local_63;
  byte local_62;
  allocator<char> local_61;
  undefined1 local_60 [4];
  bool add_shlib_flags;
  undefined1 local_29;
  cmGeneratorTarget *local_28;
  cmGeneratorTarget *tgt_local;
  string *linkLanguage_local;
  cmLocalGenerator *this_local;
  string *linkFlags;
  
  local_29 = 0;
  local_28 = tgt;
  tgt_local = (cmGeneratorTarget *)linkLanguage;
  linkLanguage_local = (string *)this;
  this_local = (cmLocalGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_62 = 0;
  local_63 = 0;
  TVar4 = cmGeneratorTarget::GetType(local_28);
  local_321 = false;
  if (TVar4 == EXECUTABLE) {
    this_00 = cmStateSnapshot::GetState(&(this->super_cmOutputConverter).StateSnapshot);
    std::allocator<char>::allocator();
    local_62 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,"TARGET_SUPPORTS_SHARED_LIBS",&local_61);
    local_63 = 1;
    local_321 = cmState::GetGlobalPropertyAsBool(this_00,(string *)local_60);
  }
  if ((local_63 & 1) != 0) {
    std::__cxx11::string::~string((string *)local_60);
  }
  if ((local_62 & 1) != 0) {
    std::allocator<char>::~allocator(&local_61);
  }
  if (local_321 != false) {
    local_64 = false;
    PVar5 = cmGeneratorTarget::GetPolicyStatusCMP0065(local_28);
    pcVar2 = local_28;
    switch(PVar5) {
    case WARN:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"ENABLE_EXPORTS",&local_89);
      bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_88);
      local_35a = false;
      if (!bVar3) {
        pcVar1 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"CMAKE_POLICY_WARNING_CMP0065",&local_b1);
        local_35a = cmMakefile::PolicyOptionalWarningEnabled(pcVar1,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator(&local_b1);
      }
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      if (local_35a != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_250,(cmPolicies *)0x41,id_00);
        poVar6 = std::operator<<((ostream *)local_230,(string *)&local_250);
        std::operator<<(poVar6,
                        "\nFor compatibility with older versions of CMake, additional flags may be added to export symbols on all executables regardless of their ENABLE_EXPORTS property."
                       );
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::ostringstream::str();
        IssueMessage(this,AUTHOR_WARNING,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
      }
    case OLD:
      local_292 = 0;
      local_293 = 0;
      bVar3 = cmGeneratorTarget::IsAIX(local_28);
      pcVar2 = local_28;
      local_382 = false;
      if (bVar3) {
        std::allocator<char>::allocator();
        local_292 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_290,"ENABLE_EXPORTS",&local_291);
        local_293 = 1;
        local_382 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_290);
      }
      local_64 = (bool)((local_382 ^ 0xffU) & 1);
      if ((local_293 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_290);
      }
      if ((local_292 & 1) != 0) {
        std::allocator<char>::~allocator(&local_291);
      }
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_2b8,(cmPolicies *)0x41,id);
      IssueMessage(this,FATAL_ERROR,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
    case NEW:
      local_2da = 0;
      local_2db = 0;
      bVar3 = cmGeneratorTarget::IsAIX(local_28);
      pcVar2 = local_28;
      local_39b = false;
      if (!bVar3) {
        std::allocator<char>::allocator();
        local_2da = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d8,"ENABLE_EXPORTS",&local_2d9);
        local_2db = 1;
        local_39b = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_2d8);
      }
      local_64 = local_39b;
      if ((local_2db & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_2d8);
      }
      if ((local_2da & 1) != 0) {
        std::allocator<char>::~allocator(&local_2d9);
      }
    }
    if ((local_64 & 1U) != 0) {
      pcVar1 = this->Makefile;
      cmStrCat<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[7]>
                (&local_300,(char (*) [27])"CMAKE_SHARED_LIBRARY_LINK_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tgt_local,
                 (char (*) [7])0xff034a);
      psVar7 = cmMakefile::GetSafeDefinition(pcVar1,&local_300);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar7);
      std::__cxx11::string::~string((string *)&local_300);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetLinkLibsCMP0065(
  std::string const& linkLanguage, cmGeneratorTarget& tgt) const
{
  std::string linkFlags;

  // Flags to link an executable to shared libraries.
  if (tgt.GetType() == cmStateEnums::EXECUTABLE &&
      this->StateSnapshot.GetState()->GetGlobalPropertyAsBool(
        "TARGET_SUPPORTS_SHARED_LIBS")) {
    bool add_shlib_flags = false;
    switch (tgt.GetPolicyStatusCMP0065()) {
      case cmPolicies::WARN:
        if (!tgt.GetPropertyAsBool("ENABLE_EXPORTS") &&
            this->Makefile->PolicyOptionalWarningEnabled(
              "CMAKE_POLICY_WARNING_CMP0065")) {
          std::ostringstream w;
          /* clang-format off */
            w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0065) << "\n"
              "For compatibility with older versions of CMake, "
              "additional flags may be added to export symbols on all "
              "executables regardless of their ENABLE_EXPORTS property.";
          /* clang-format on */
          this->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to always add the flags, except on AIX where
        // we compute symbol exports if ENABLE_EXPORTS is on.
        add_shlib_flags =
          !(tgt.IsAIX() && tgt.GetPropertyAsBool("ENABLE_EXPORTS"));
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0065));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to only add the flags if ENABLE_EXPORTS is on,
        // except on AIX where we compute symbol exports.
        add_shlib_flags =
          !tgt.IsAIX() && tgt.GetPropertyAsBool("ENABLE_EXPORTS");
        break;
    }

    if (add_shlib_flags) {
      linkFlags = this->Makefile->GetSafeDefinition(
        cmStrCat("CMAKE_SHARED_LIBRARY_LINK_", linkLanguage, "_FLAGS"));
    }
  }
  return linkFlags;
}